

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CycleBreakingAbstract.h
# Opt level: O1

DFA<covenant::Sym> * __thiscall
covenant::CycleBreakingAbstract<covenant::Sym>::do_abstraction
          (DFA<covenant::Sym> *__return_storage_ptr__,CycleBreakingAbstract<covenant::Sym> *this,
          CFG *g,bool is_regular)

{
  char cVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  const_iterator cVar4;
  string *psVar5;
  undefined7 in_register_00000009;
  sp_counted_base *__n;
  void *__buf;
  CFG *pCVar6;
  CFG *this_00;
  DFA<covenant::Sym> *__return_storage_ptr___00;
  bool bVar7;
  CycleBreaking<covenant::Sym> transformer;
  CFG str_reg_cfg;
  DFA<covenant::Sym> dfa;
  CycleBreaking<covenant::Sym> local_61d;
  undefined4 local_61c;
  CFG *local_618;
  DFA<covenant::Sym> *local_610;
  DFA<covenant::Sym> local_608;
  key_type local_598;
  element_type *local_578;
  shared_count local_570;
  undefined1 *local_568;
  long local_560;
  undefined1 local_558 [16];
  undefined1 *local_548;
  long local_540;
  undefined1 local_538 [16];
  key_type local_528;
  vector<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
  local_508;
  undefined1 local_4e8 [24];
  vector<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
  local_4d0;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  local_4b8;
  _Bit_type *local_4a0;
  uint uStack_498;
  pointer local_490;
  uint uStack_488;
  undefined4 uStack_484;
  pointer local_480;
  undefined1 local_478 [24];
  vector<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
  local_460;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  local_448;
  pointer local_430;
  uint uStack_428;
  pointer local_420;
  uint uStack_418;
  undefined4 uStack_414;
  pointer local_410;
  undefined1 local_3f8 [48];
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  local_3c8;
  pointer local_3b0;
  uint local_3a8;
  pointer local_3a0;
  uint local_398;
  pointer local_390;
  CFGConnect local_378;
  pointer local_2f0;
  table<boost::unordered::detail::map<std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_unsigned_int,_unsigned_int,_boost::hash<unsigned_int>,_std::equal_to<unsigned_int>_>_>
  local_2d8;
  shared_count local_2a0 [2];
  vector<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
  local_290;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  local_278;
  _Bit_type *local_260;
  uint local_258;
  _Bit_type *local_250;
  uint local_248;
  _Bit_pointer local_240;
  CFG local_230;
  CFG local_1b0;
  CFG local_130;
  CFG local_b0;
  
  local_608._tfac.px = (g->_tfac).px;
  __n = (g->_tfac).pn.pi_;
  if (__n != (sp_counted_base *)0x0) {
    LOCK();
    __n->use_count_ = __n->use_count_ + 1;
    UNLOCK();
  }
  if (__n != (sp_counted_base *)0x0) {
    LOCK();
    __n->use_count_ = __n->use_count_ + 1;
    UNLOCK();
  }
  local_608.start = 0;
  local_608.accepts.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  local_608.accepts.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_finish.super__Bit_iterator_base._8_8_ =
       local_608.accepts.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
       ._M_finish.super__Bit_iterator_base._8_8_ & 0xffffffff00000000;
  local_608.accepts.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_end_of_storage = (_Bit_pointer)0x0;
  local_608.trans.
  super__Vector_base<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_608.trans.
  super__Vector_base<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_608.trans.
  super__Vector_base<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_608.eps.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_608.eps.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_608.eps.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
  local_608.eps.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
  local_608.accepts.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_start.super__Bit_iterator_base._M_p._0_4_ = 0;
  local_608.accepts.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_start.super__Bit_iterator_base._M_p._4_4_ = 0;
  local_608.accepts.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_start.super__Bit_iterator_base._M_offset = 0;
  local_608._tfac.pn.pi_ = __n;
  local_578 = local_608._tfac.px;
  local_570.pi_ = __n;
  boost::detail::shared_count::~shared_count(&local_570);
  local_61c = (undefined4)CONCAT71(in_register_00000009,is_regular);
  local_618 = g;
  local_610 = __return_storage_ptr__;
  if (is_regular) {
    if (avy::AvyLogFlag == '\0') {
      bVar7 = false;
    }
    else {
      local_4e8._0_8_ = local_4e8 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_4e8,"verbose","");
      cVar4 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)avy::AvyLog_abi_cxx11_,(key_type *)local_4e8);
      bVar7 = cVar4._M_node != (_Base_ptr)(avy::AvyLog_abi_cxx11_ + 8);
      if ((undefined1 *)local_4e8._0_8_ != local_4e8 + 0x10) {
        operator_delete((void *)local_4e8._0_8_);
      }
    }
    if (bVar7) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"The CFG is regular thus no need to abstract.\n",0x2d);
    }
    CFG::CFG(&local_b0,g);
    StronglyRegularToFA<covenant::Sym>::StronglyRegularToFA
              ((StronglyRegularToFA<covenant::Sym> *)local_3f8,&local_b0);
    CFG::~CFG(&local_b0);
    StronglyRegularToFA<covenant::Sym>::make_fa
              ((DFA<covenant::Sym> *)local_478,(StronglyRegularToFA<covenant::Sym> *)local_3f8);
    uVar3 = local_478._8_8_;
    uVar2 = local_478._0_8_;
    local_598._M_string_length = (size_type)local_608._tfac.pn.pi_;
    local_598._M_dataplus._M_p = (pointer)local_608._tfac.px;
    local_478._0_8_ = (element_type *)0x0;
    local_478._8_8_ = (sp_counted_base *)0x0;
    local_608._tfac.px = (element_type *)uVar2;
    local_608._tfac.pn.pi_ = (sp_counted_base *)uVar3;
    boost::detail::shared_count::~shared_count((shared_count *)&local_598._M_string_length);
    local_598.field_2._M_allocated_capacity =
         (size_type)
         local_608.trans.
         super__Vector_base<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_598._M_string_length =
         (size_type)
         local_608.trans.
         super__Vector_base<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    local_598._M_dataplus._M_p =
         (pointer)local_608.trans.
                  super__Vector_base<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
    local_608.start = local_478._16_4_;
    local_608.trans.
    super__Vector_base<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         local_460.
         super__Vector_base<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_608.trans.
    super__Vector_base<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         local_460.
         super__Vector_base<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    local_608.trans.
    super__Vector_base<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         local_460.
         super__Vector_base<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_460.
    super__Vector_base<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_460.
    super__Vector_base<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_460.
    super__Vector_base<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::
    vector<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
    ::~vector((vector<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
               *)&local_598);
    local_598._M_string_length =
         (size_type)
         local_608.eps.
         super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    local_598._M_dataplus._M_p =
         (pointer)local_608.eps.
                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
    local_598.field_2._M_allocated_capacity =
         CONCAT44(local_608.eps.
                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,
                  local_608.eps.
                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_);
    local_608.eps.
    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         local_448.
         super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_608.eps.
    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         local_448.
         super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    local_608.eps.
    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ =
         SUB84(local_448.
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage,0);
    local_608.eps.
    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
         (undefined4)
         ((ulong)local_448.
                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage >> 0x20);
    local_448.
    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_448.
    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_448.
    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::
    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               *)&local_598);
    if ((void *)CONCAT44(local_608.accepts.super__Bvector_base<std::allocator<bool>_>._M_impl.
                         super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p._4_4_,
                         local_608.accepts.super__Bvector_base<std::allocator<bool>_>._M_impl.
                         super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p._0_4_) !=
        (void *)0x0) {
      operator_delete((void *)CONCAT44(local_608.accepts.super__Bvector_base<std::allocator<bool>_>.
                                       _M_impl.super__Bvector_impl_data._M_start.
                                       super__Bit_iterator_base._M_p._4_4_,
                                       local_608.accepts.super__Bvector_base<std::allocator<bool>_>.
                                       _M_impl.super__Bvector_impl_data._M_start.
                                       super__Bit_iterator_base._M_p._0_4_));
    }
    local_608.accepts.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_end_of_storage = (_Bit_pointer)local_410;
    local_608.accepts.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_finish.super__Bit_iterator_base._8_8_ = CONCAT44(uStack_414,uStack_418);
    local_608.accepts.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)local_420;
    local_608.accepts.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_start.super__Bit_iterator_base._M_p._0_4_ = SUB84(local_430,0);
    local_608.accepts.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_start.super__Bit_iterator_base._M_p._4_4_ = (undefined4)((ulong)local_430 >> 0x20);
    local_608.accepts.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_start.super__Bit_iterator_base._M_offset = uStack_428;
    local_430 = (pointer)0x0;
    uStack_428 = 0;
    local_420 = (pointer)0x0;
    uStack_418 = 0;
    local_410 = (pointer)0x0;
    std::
    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::~vector(&local_448);
    std::
    vector<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
    ::~vector(&local_460);
    boost::detail::shared_count::~shared_count((shared_count *)(local_478 + 8));
    if (local_260 != (_Bit_type *)0x0) {
      operator_delete(local_260);
      local_260 = (_Bit_type *)0x0;
      local_258 = 0;
      local_250 = (_Bit_type *)0x0;
      local_248 = 0;
      local_240 = (_Bit_pointer)0x0;
    }
    std::
    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::~vector(&local_278);
    std::
    vector<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
    ::~vector(&local_290);
    boost::detail::shared_count::~shared_count(local_2a0);
    boost::unordered::detail::
    table<boost::unordered::detail::map<std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_unsigned_int,_unsigned_int,_boost::hash<unsigned_int>,_std::equal_to<unsigned_int>_>_>
    ::~table(&local_2d8);
    __return_storage_ptr___00 = local_610;
    pCVar6 = local_618;
    if (local_2f0 != (pointer)0x0) {
      operator_delete(local_2f0);
    }
    CFGConnect::~CFGConnect(&local_378);
    this_00 = (CFG *)local_3f8;
  }
  else {
    if (avy::AvyLogFlag == '\0') {
      bVar7 = false;
    }
    else {
      local_598._M_dataplus._M_p = (pointer)&local_598.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_598,"verbose","");
      cVar4 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)avy::AvyLog_abi_cxx11_,&local_598);
      bVar7 = cVar4._M_node != (_Base_ptr)(avy::AvyLog_abi_cxx11_ + 8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_598._M_dataplus._M_p != &local_598.field_2) {
        operator_delete(local_598._M_dataplus._M_p);
      }
    }
    if (bVar7) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Applied cycle breaking abstraction.\n",0x24);
    }
    CFG::CFG(&local_130,g);
    CycleBreaking<covenant::Sym>::Approximate((CFG *)local_478,&local_61d,&local_130);
    CFG::~CFG(&local_130);
    cVar1 = avy::AvyLogFlag;
    if (avy::AvyLogFlag == '\x01') {
      local_528._M_dataplus._M_p = (pointer)&local_528.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_528,"abstraction","");
      cVar4 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)avy::AvyLog_abi_cxx11_,&local_528);
      bVar7 = cVar4._M_node != (_Base_ptr)(avy::AvyLog_abi_cxx11_ + 8);
    }
    else {
      bVar7 = false;
    }
    if ((cVar1 != '\0') &&
       ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_528._M_dataplus._M_p != &local_528.field_2)) {
      operator_delete(local_528._M_dataplus._M_p);
    }
    if (bVar7) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Approximated regular grammar:\n",0x1e);
      CFG::CFG(&local_1b0,(CFG *)local_478);
      CFG::write(&local_1b0,0x1ad2b8,__buf,(size_t)__n);
      CFG::~CFG(&local_1b0);
    }
    CFG::CFG(&local_230,(CFG *)local_478);
    StronglyRegularToFA<covenant::Sym>::StronglyRegularToFA
              ((StronglyRegularToFA<covenant::Sym> *)local_3f8,&local_230);
    CFG::~CFG(&local_230);
    StronglyRegularToFA<covenant::Sym>::make_fa
              ((DFA<covenant::Sym> *)local_4e8,(StronglyRegularToFA<covenant::Sym> *)local_3f8);
    uVar3 = local_4e8._8_8_;
    uVar2 = local_4e8._0_8_;
    local_508.
    super__Vector_base<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_608._tfac.pn.pi_;
    local_508.
    super__Vector_base<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)local_608._tfac.px;
    local_4e8._0_8_ = (pointer)0x0;
    local_4e8._8_8_ = (sp_counted_base *)0x0;
    local_608._tfac.px = (element_type *)uVar2;
    local_608._tfac.pn.pi_ = (sp_counted_base *)uVar3;
    boost::detail::shared_count::~shared_count
              ((shared_count *)
               &local_508.
                super__Vector_base<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish);
    local_508.
    super__Vector_base<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         local_608.trans.
         super__Vector_base<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_508.
    super__Vector_base<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         local_608.trans.
         super__Vector_base<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    local_508.
    super__Vector_base<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         local_608.trans.
         super__Vector_base<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_608.start = local_4e8._16_4_;
    local_608.trans.
    super__Vector_base<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         local_4d0.
         super__Vector_base<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_608.trans.
    super__Vector_base<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         local_4d0.
         super__Vector_base<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    local_608.trans.
    super__Vector_base<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         local_4d0.
         super__Vector_base<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_4d0.
    super__Vector_base<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_4d0.
    super__Vector_base<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_4d0.
    super__Vector_base<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::
    vector<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
    ::~vector(&local_508);
    local_508.
    super__Vector_base<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         (pointer)local_608.eps.
                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
    local_508.
    super__Vector_base<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)local_608.eps.
                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
    local_508.
    super__Vector_base<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)CONCAT44(local_608.eps.
                           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,
                           local_608.eps.
                           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_);
    local_608.eps.
    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         local_4b8.
         super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_608.eps.
    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         local_4b8.
         super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    local_608.eps.
    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ =
         SUB84(local_4b8.
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage,0);
    local_608.eps.
    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
         (undefined4)
         ((ulong)local_4b8.
                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage >> 0x20);
    local_4b8.
    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_4b8.
    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_4b8.
    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::
    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               *)&local_508);
    if ((void *)CONCAT44(local_608.accepts.super__Bvector_base<std::allocator<bool>_>._M_impl.
                         super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p._4_4_,
                         local_608.accepts.super__Bvector_base<std::allocator<bool>_>._M_impl.
                         super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p._0_4_) !=
        (void *)0x0) {
      operator_delete((void *)CONCAT44(local_608.accepts.super__Bvector_base<std::allocator<bool>_>.
                                       _M_impl.super__Bvector_impl_data._M_start.
                                       super__Bit_iterator_base._M_p._4_4_,
                                       local_608.accepts.super__Bvector_base<std::allocator<bool>_>.
                                       _M_impl.super__Bvector_impl_data._M_start.
                                       super__Bit_iterator_base._M_p._0_4_));
    }
    local_608.accepts.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_end_of_storage = (_Bit_pointer)local_480;
    local_608.accepts.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_finish.super__Bit_iterator_base._8_8_ = CONCAT44(uStack_484,uStack_488);
    local_608.accepts.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)local_490;
    local_608.accepts.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_start.super__Bit_iterator_base._M_p._0_4_ = SUB84(local_4a0,0);
    local_608.accepts.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_start.super__Bit_iterator_base._M_p._4_4_ = (undefined4)((ulong)local_4a0 >> 0x20);
    local_608.accepts.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_start.super__Bit_iterator_base._M_offset = uStack_498;
    local_4a0 = (_Bit_type *)0x0;
    uStack_498 = 0;
    local_490 = (pointer)0x0;
    uStack_488 = 0;
    local_480 = (pointer)0x0;
    std::
    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::~vector(&local_4b8);
    std::
    vector<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
    ::~vector(&local_4d0);
    boost::detail::shared_count::~shared_count((shared_count *)(local_4e8 + 8));
    if (local_260 != (_Bit_type *)0x0) {
      operator_delete(local_260);
      local_260 = (_Bit_type *)0x0;
      local_258 = 0;
      local_250 = (_Bit_type *)0x0;
      local_248 = 0;
      local_240 = (_Bit_pointer)0x0;
    }
    std::
    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::~vector(&local_278);
    std::
    vector<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
    ::~vector(&local_290);
    boost::detail::shared_count::~shared_count(local_2a0);
    boost::unordered::detail::
    table<boost::unordered::detail::map<std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_unsigned_int,_unsigned_int,_boost::hash<unsigned_int>,_std::equal_to<unsigned_int>_>_>
    ::~table(&local_2d8);
    __return_storage_ptr___00 = local_610;
    pCVar6 = local_618;
    if (local_2f0 != (pointer)0x0) {
      operator_delete(local_2f0);
    }
    CFGConnect::~CFGConnect(&local_378);
    CFG::~CFG((CFG *)local_3f8);
    this_00 = (CFG *)local_478;
  }
  CFG::~CFG(this_00);
  DFA<covenant::Sym>::eps_elim(&local_608);
  DFA<covenant::Sym>::makeDFA((dfa_t *)local_3f8,&local_608,pCVar6->alphstart,pCVar6->alphsz);
  DFA<covenant::Sym>::minimize
            (__return_storage_ptr___00,(DFA<covenant::Sym> *)local_3f8,pCVar6->alphstart,
             pCVar6->alphsz);
  bVar7 = DFA<covenant::Sym>::eliminateDeadStates(__return_storage_ptr___00);
  if (!bVar7) {
    psVar5 = (string *)__cxa_allocate_exception(0x20);
    if ((char)local_61c == '\0') {
      local_568 = local_558;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_568,"One CFG is empty after abstraction.\n======\nUNSAT\n======",
                 "");
      *(string **)psVar5 = psVar5 + 0x10;
      std::__cxx11::string::_M_construct<char*>(psVar5,local_568,local_568 + local_560);
      __cxa_throw(psVar5,&Exit::typeinfo,Exit::~Exit);
    }
    local_548 = local_538;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_548,"One CFG is trivially empty.\n======\nUNSAT\n======","");
    *(string **)psVar5 = psVar5 + 0x10;
    std::__cxx11::string::_M_construct<char*>(psVar5,local_548,local_548 + local_540);
    __cxa_throw(psVar5,&Exit::typeinfo,Exit::~Exit);
  }
  if (local_3b0 != (pointer)0x0) {
    operator_delete(local_3b0);
    local_3b0 = (pointer)0x0;
    local_3a8 = 0;
    local_3a0 = (pointer)0x0;
    local_398 = 0;
    local_390 = (pointer)0x0;
  }
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector(&local_3c8);
  std::
  vector<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
  ::~vector((vector<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
             *)(local_3f8 + 0x18));
  boost::detail::shared_count::~shared_count((shared_count *)(local_3f8 + 8));
  if ((void *)CONCAT44(local_608.accepts.super__Bvector_base<std::allocator<bool>_>._M_impl.
                       super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p._4_4_,
                       local_608.accepts.super__Bvector_base<std::allocator<bool>_>._M_impl.
                       super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p._0_4_) !=
      (void *)0x0) {
    operator_delete((void *)CONCAT44(local_608.accepts.super__Bvector_base<std::allocator<bool>_>.
                                     _M_impl.super__Bvector_impl_data._M_start.
                                     super__Bit_iterator_base._M_p._4_4_,
                                     local_608.accepts.super__Bvector_base<std::allocator<bool>_>.
                                     _M_impl.super__Bvector_impl_data._M_start.
                                     super__Bit_iterator_base._M_p._0_4_));
    local_608.accepts.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_start.super__Bit_iterator_base._M_p._0_4_ = 0;
    local_608.accepts.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_start.super__Bit_iterator_base._M_p._4_4_ = 0;
    local_608.accepts.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_start.super__Bit_iterator_base._M_offset = 0;
    local_608.accepts.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    local_608.accepts.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_finish.super__Bit_iterator_base._8_8_ =
         local_608.accepts.super__Bvector_base<std::allocator<bool>_>._M_impl.
         super__Bvector_impl_data._M_finish.super__Bit_iterator_base._8_8_ & 0xffffffff00000000;
    local_608.accepts.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_end_of_storage = (_Bit_pointer)0x0;
  }
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector(&local_608.eps);
  std::
  vector<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
  ::~vector(&local_608.trans);
  boost::detail::shared_count::~shared_count(&local_608._tfac.pn);
  return __return_storage_ptr___00;
}

Assistant:

DFA<EdgeSym> do_abstraction(CFG &g, const bool is_regular)
  {
    bool is_abs_done = false;
    DFA<EdgeSym> sfa (g.getTermFactory ());
    if (is_regular)
    {        
      LOG( "verbose", cout << "The CFG is regular thus no need to abstract.\n");

      StronglyRegularToFA<EdgeSym>  conv(g);
      sfa = conv.make_fa();
    }
    else
    {
      LOG( "verbose" , cout << "Applied cycle breaking abstraction.\n");
      is_abs_done = true;
      CycleBreaking<EdgeSym> transformer;
      CFG str_reg_cfg = transformer.Approximate(g);

      LOG ("abstraction" , 
           cout << "Approximated regular grammar:\n" << str_reg_cfg);

      StronglyRegularToFA<EdgeSym> conv(str_reg_cfg);
      sfa = conv.make_fa();
    }

    /// Simplify the automata
    sfa.eps_elim();

    DFA<EdgeSym> dfa     = sfa.makeDFA (g.alphstart, g.alphsz);
    DFA<EdgeSym> min_dfa = dfa.minimize (g.alphstart, g.alphsz);
    bool is_not_empty    = min_dfa.eliminateDeadStates();
    if (!is_not_empty)
    {
      if  (!is_abs_done) 
        throw Exit("One CFG is trivially empty.\n======\nUNSAT\n======");
      else
        throw Exit("One CFG is empty after abstraction.\n======\nUNSAT\n======");
    }
    return min_dfa;
  }